

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcEdgeLogDerivativesStates
          (BeagleCPUImpl<float,_1,_0> *this,int *tipStates,float *preOrderPartial,
          int firstDerivativeIndex,int secondDerivativeIndex,double *categoryRates,
          float *categoryWeights,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  float fVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int k;
  float denominator;
  float numerator;
  int state;
  int patternIndex;
  int pattern;
  int category;
  float *firstDerivMatrix;
  double *categoryRates_local;
  int secondDerivativeIndex_local;
  int firstDerivativeIndex_local;
  float *preOrderPartial_local;
  int *tipStates_local;
  BeagleCPUImpl<float,_1,_0> *this_local;
  
  pfVar2 = this->gTransitionMatrices[firstDerivativeIndex];
  for (category = 0; category < this->kCategoryCount; category = category + 1) {
    for (pattern = 0; pattern < this->kPatternCount; pattern = pattern + 1) {
      iVar4 = category * this->kPatternCount + pattern;
      numerator = 0.0;
      fVar1 = preOrderPartial
              [iVar4 * this->kPartialsPaddedStateCount + tipStates[pattern] % this->kStateCount];
      for (k = 0; k < this->kStateCount; k = k + 1) {
        auVar3 = vfmadd213ss_fma(ZEXT416((uint)preOrderPartial
                                               [iVar4 * this->kPartialsPaddedStateCount + k]),
                                 ZEXT416((uint)pfVar2[category * this->kMatrixSize +
                                                      k * this->kTransPaddedStateCount +
                                                      tipStates[pattern]]),ZEXT416((uint)numerator))
        ;
        numerator = auVar3._0_4_;
      }
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)numerator),ZEXT416((uint)categoryWeights[category]),
                               ZEXT416((uint)this->grandNumeratorDerivTmp[pattern]));
      this->grandNumeratorDerivTmp[pattern] = auVar3._0_4_;
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)categoryWeights[category]),
                               ZEXT416((uint)this->grandDenominatorDerivTmp[pattern]));
      this->grandDenominatorDerivTmp[pattern] = auVar3._0_4_;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogDerivativesStates(const int *tipStates,
                                                                     const REALTYPE *preOrderPartial,
                                                                     const int firstDerivativeIndex,
                                                                     const int secondDerivativeIndex,
                                                                     const double *categoryRates,
                                                                     const REALTYPE *categoryWeights,
                                                                     double *outDerivatives,
                                                                     double *outSumDerivatives,
                                                                     double *outSumSquaredDerivatives) {

    const REALTYPE *firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];

    for (int category = 0; category < kCategoryCount; category++) {

        for (int pattern = 0; pattern < kPatternCount; pattern++) {

            const int patternIndex = category * kPatternCount + pattern;
            const int state = tipStates[pattern];

            REALTYPE numerator = 0.0;
            REALTYPE denominator = preOrderPartial[patternIndex * kPartialsPaddedStateCount + (state % kStateCount)];
            // TODO (state % kStateCount) is not correct; should imply missing character
            // TODO See calcCrossProductsStates() for possible solution

            for (int k = 0; k < kStateCount; k++) {
                numerator += firstDerivMatrix[category * kMatrixSize + k * kTransPaddedStateCount + state] *
                             preOrderPartial[patternIndex * kPartialsPaddedStateCount + k];
            }

            grandNumeratorDerivTmp[pattern] += categoryWeights[category] * numerator;
            grandDenominatorDerivTmp[pattern] += categoryWeights[category] * denominator;
        }
    }
}